

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

longlong nullcGetResultLong(void)

{
  longlong local_10;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    local_10 = 0;
  }
  else if (NULLC::currExec == 1) {
    local_10 = ExecutorX86::GetResultLong(NULLC::executorX86);
  }
  else if (NULLC::currExec == 0) {
    local_10 = ExecutorRegVm::GetResultLong(NULLC::executorRegVm);
  }
  else {
    local_10 = 0;
  }
  return local_10;
}

Assistant:

long long nullcGetResultLong()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResultLong();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResultLong();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResultLong();
#endif

	return 0;
}